

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElement::~IfcDistributionControlElement
          (IfcDistributionControlElement *this)

{
  *(undefined8 *)&this[-1].field_0x60 = 0x875ae8;
  *(undefined8 *)&this->field_0x48 = 0x875c00;
  *(undefined8 *)&this[-1].field_0xe8 = 0x875b10;
  *(undefined8 *)&this[-1].field_0xf8 = 0x875b38;
  *(undefined8 *)&this[-1].field_0x130 = 0x875b60;
  *(undefined8 *)
   &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>.
    field_0x18 = 0x875b88;
  *(undefined8 *)this = 0x875bb0;
  *(undefined8 *)&this->field_0x10 = 0x875bd8;
  if (*(undefined1 **)&this->field_0x20 != &this->field_0x30) {
    operator_delete(*(undefined1 **)&this->field_0x20,*(long *)&this->field_0x30 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x60,&PTR_construction_vtable_24__00875c20);
  operator_delete(&this[-1].field_0x60,0x198);
  return;
}

Assistant:

IfcDistributionControlElement() : Object("IfcDistributionControlElement") {}